

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_NtkRetimeCreateDelayInfo(Wln_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Wln_Vec_t *pWVar3;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar9;
  ulong uVar10;
  
  if ((pNtk->vInstIds).nSize < 1) {
    puts("The design has no delay information.");
    uVar2 = (pNtk->vTypes).nCap;
    if ((pNtk->vInstIds).nCap < (int)uVar2) {
      piVar5 = (pNtk->vInstIds).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar2 << 2);
      }
      (pNtk->vInstIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vInstIds).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((pNtk->vInstIds).pArray,0,(ulong)uVar2 * 4);
    }
    (pNtk->vInstIds).nSize = uVar2;
    if (1 < (pNtk->vTypes).nSize) {
      piVar5 = (pNtk->vTypes).pArray;
      lVar6 = 1;
      lVar7 = 0x14;
      do {
        iVar1 = piVar5[lVar6];
        uVar2 = iVar1 - 0x59;
        if ((uVar2 < 4) && (uVar2 != 1)) {
          iVar1 = (pNtk->vInstIds).nSize;
          iVar8 = 1;
LAB_0038b66a:
          if (iVar1 <= lVar6) goto LAB_0038b75d;
          (pNtk->vInstIds).pArray[lVar6] = iVar8;
        }
        else if ((iVar1 - 5U < 0xfffffffe) && (0 < *(int *)((long)&pNtk->vFanins->nCap + lVar7))) {
          iVar1 = (pNtk->vInstIds).nSize;
          iVar8 = 10;
          goto LAB_0038b66a;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar6 < (pNtk->vTypes).nSize);
    }
    if (0 < (pNtk->vCos).nSize) {
      piVar5 = (pNtk->vCos).pArray;
      pWVar3 = pNtk->vFanins;
      lVar6 = 0;
      do {
        iVar1 = piVar5[lVar6];
        paVar9 = &pWVar3[iVar1].field_2;
        if (2 < pWVar3[iVar1].nSize) {
          paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
        }
        iVar8 = paVar9->Array[0];
        if (((long)iVar8 < 0) || ((pNtk->vTypes).nSize <= iVar8)) goto LAB_0038b73e;
        if ((pNtk->vTypes).pArray[iVar8] != 0x4b) {
          paVar9 = &pWVar3[iVar1].field_2;
          if (2 < pWVar3[iVar1].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          iVar1 = paVar9->Array[0];
          if (((long)iVar1 < 0) || ((pNtk->vInstIds).nSize <= iVar1)) {
LAB_0038b75d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pNtk->vInstIds).pArray[iVar1] = 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (pNtk->vCos).nSize);
    }
    puts(
        "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs."
        );
    return;
  }
  puts("Using delays given by the user in the input file.");
  if (1 < (pNtk->vTypes).nSize) {
    uVar10 = 1;
    do {
      iVar1 = (pNtk->vTypes).pArray[uVar10];
      if ((1 < iVar1 - 3U) && (iVar1 != 0x61)) {
        if ((long)(pNtk->vInstIds).nSize <= (long)uVar10) {
LAB_0038b73e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pNtk->vInstIds).pArray[uVar10] == 0) {
          pcVar4 = Abc_OperName(iVar1);
          printf("Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n"
                 ,uVar10 & 0xffffffff,pcVar4);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(pNtk->vTypes).nSize);
  }
  return;
}

Assistant:

void Wln_NtkRetimeCreateDelayInfo( Wln_Ntk_t * pNtk )
{
    int i, iObj;
//    if ( Wln_NtkHasInstId(pNtk) )
//        Vec_IntErase( &pNtk->vInstIds );
    if ( Wln_NtkHasInstId(pNtk) )
    {
        printf( "Using delays given by the user in the input file.\n" );
        Wln_NtkForEachObj( pNtk, iObj )
            if ( !Wln_ObjIsCio(pNtk, iObj) && !Wln_ObjIsConst(pNtk, iObj) && Wln_ObjInstId(pNtk, iObj) == 0 )
                printf( "Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n", iObj, Abc_OperName(Wln_ObjType(pNtk, iObj)) );
    }
    else
    {
        printf( "The design has no delay information.\n" );
        Wln_NtkCleanInstId(pNtk);
        Wln_NtkForEachObj( pNtk, iObj )
        {
            if ( Wln_ObjIsFf(pNtk, iObj) || Wln_ObjType(pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(pNtk, iObj) == ABC_OPER_CONCAT )
                Wln_ObjSetInstId( pNtk, iObj, 1 );
            else if ( !Wln_ObjIsCio(pNtk, iObj) && Wln_ObjFaninNum(pNtk, iObj) > 0 )
                Wln_ObjSetInstId( pNtk, iObj, 10 );
        }
        Wln_NtkForEachCo( pNtk, iObj, i ) 
        {
            if ( Wln_ObjType(pNtk, Wln_ObjFanin0(pNtk, iObj)) != ABC_OPER_LUT )
                Wln_ObjSetInstId( pNtk, Wln_ObjFanin0(pNtk, iObj), 1 );
        }
        printf( "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs.\n" );
    }
}